

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utf8Codex.cpp
# Opt level: O0

charcount_t utf8::ByteIndexIntoCharacterIndex(LPCUTF8 pch,size_t cbIndex,DecodeOptions options)

{
  LPCUTF8 puVar1;
  bool bVar2;
  LPCUTF8 s;
  uint32 ch4;
  charcount_t i;
  LPCUTF8 pchEndMinus4;
  LPCUTF8 pchEnd;
  LPCUTF8 pchCurrent;
  DecodeOptions localOptions;
  DecodeOptions options_local;
  size_t cbIndex_local;
  LPCUTF8 pch_local;
  
  s._4_4_ = 0;
  pchEnd = pch;
  pchCurrent._0_4_ = options;
  pchCurrent._4_4_ = options;
  _localOptions = cbIndex;
  cbIndex_local = (size_t)pch;
  bVar2 = IsAligned(pch);
  if (bVar2) goto LAB_008d45aa;
  while ((puVar1 = pchEnd, pchEnd < pch + cbIndex &&
         (Decode(&pchEnd,pch + cbIndex,(DecodeOptions *)&pchCurrent,(bool *)0x0), puVar1 != pchEnd))
        ) {
    s._4_4_ = s._4_4_ + 1;
    bVar2 = IsAligned(pchEnd);
    if (bVar2) {
LAB_008d45aa:
      for (; (pchEnd < pch + (cbIndex - 4) && ((*(uint *)pchEnd & 0x80808080) == 0));
          pchEnd = pchEnd + 4) {
        s._4_4_ = s._4_4_ + 4;
      }
    }
  }
  return s._4_4_;
}

Assistant:

charcount_t ByteIndexIntoCharacterIndex(__in_ecount(cbIndex) LPCUTF8 pch, size_t cbIndex, DecodeOptions options)
    {
        DecodeOptions localOptions = options;
        LPCUTF8 pchCurrent = pch;
        LPCUTF8 pchEnd = pch + cbIndex;
        LPCUTF8 pchEndMinus4 = pch + (cbIndex - 4);
        charcount_t i = 0;

        // Avoid using a reinterpret_cast to start a misaligned read.
        if (!IsAligned(pchCurrent)) goto LSlowPath;

LFastPath:
        // Skip 4 bytes at a time.
        while (pchCurrent < pchEndMinus4)
        {
            uint32 ch4 = *reinterpret_cast<const uint32 *>(pchCurrent);
            if ((ch4 & 0x80808080) == 0)
            {
                pchCurrent += 4;
                i += 4;
            }
            else break;
        }

LSlowPath:
        while (pchCurrent < pchEnd)
        {
            LPCUTF8 s = pchCurrent;
            Decode(pchCurrent, pchEnd, localOptions);
            if (s == pchCurrent) break;
            i++;

            // Try to return to the fast path avoiding misaligned reads.
            if (IsAligned(pchCurrent)) goto LFastPath;
        }

        return i;
    }